

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.c
# Opt level: O3

Card * card_createFromId(char *id)

{
  int iVar1;
  size_t sVar2;
  Card *pCVar3;
  char cVar4;
  SUIT SVar5;
  char local_1b;
  undefined2 local_1a;
  
  local_1a = 0;
  local_1b = *id;
  cVar4 = id[1];
  sVar2 = strlen(id);
  if (sVar2 == 3) {
    local_1a = CONCAT11(local_1a._1_1_,cVar4);
    cVar4 = id[2];
  }
  iVar1 = atoi(&local_1b);
  if (cVar4 == 'c') {
    SVar5 = CLUB;
  }
  else {
    SVar5 = SPADE;
    if (cVar4 != 's') {
      SVar5 = (cVar4 == 'h') + DIAMOND;
    }
  }
  pCVar3 = (Card *)malloc(4);
  pCVar3->rank = (uchar)iVar1;
  pCVar3->suit = SVar5;
  pCVar3->color = (byte)(SVar5 - SPADE) < 0xfe;
  pCVar3->faceUp = true;
  return pCVar3;
}

Assistant:

Card * card_createFromId(char * id)
{
	char rank[3] = {0, 0, 0};
	rank[0] = id[0];
	char suit = id[1];

	if(strlen(id)==3)
	{
		rank[1] = id[1];
		suit = id[2];
	}

	return card_create(atoi(rank), (suit=='s' ? SPADE : (suit=='c' ? CLUB : (suit=='h' ? HEART : DIAMOND))), true);
}